

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

value_type pugi::impl::anon_unknown_0::utf8_counter::low(value_type result,uint32_t ch)

{
  uint32_t ch_local;
  value_type result_local;
  
  if (ch < 0x80) {
    result_local = result + 1;
  }
  else if (ch < 0x800) {
    result_local = result + 2;
  }
  else {
    result_local = result + 3;
  }
  return result_local;
}

Assistant:

static value_type low(value_type result, uint32_t ch)
		{
			// U+0000..U+007F
			if (ch < 0x80) return result + 1;
			// U+0080..U+07FF
			else if (ch < 0x800) return result + 2;
			// U+0800..U+FFFF
			else return result + 3;
		}